

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlvoid.c
# Opt level: O3

ebml_element * Copy(ebml_element *Element)

{
  filepos_t fVar1;
  ebml_element *peVar2;
  
  peVar2 = EBML_ElementCreate(Element,Element->Context,0,-1);
  if (peVar2 != (ebml_element *)0x0) {
    peVar2->bValueIsSet = Element->bValueIsSet;
    fVar1 = Element->ElementPosition;
    peVar2->DataSize = Element->DataSize;
    peVar2->ElementPosition = fVar1;
    peVar2->SizeLength = Element->SizeLength;
    fVar1 = Element->EndPosition;
    peVar2->SizePosition = Element->SizePosition;
    peVar2->EndPosition = fVar1;
    peVar2->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
  }
  return peVar2;
}

Assistant:

static ebml_element *Copy(const ebml_element *Element)
{
    ebml_element *Result = EBML_ElementCreate(Element,Element->Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->bValueIsSet = Element->bValueIsSet;
        Result->DataSize = Element->DataSize;
        Result->ElementPosition = Element->ElementPosition;
        Result->SizeLength = Element->SizeLength;
        Result->SizePosition = Element->SizePosition;
        Result->EndPosition = Element->EndPosition;
        Result->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
    }
    return Result;
}